

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void * reg_malloc(c2m_ctx_t c2m_ctx,size_t s)

{
  htab_size_t *phVar1;
  size_t sVar2;
  VARR_htab_ind_t *pVVar3;
  VARR_HTAB_EL_tab_str_t *pVVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  FILE *__ptr;
  void_ptr_t pvVar7;
  void_ptr_t pvVar8;
  void_ptr_t pvVar9;
  tab_str_t tVar10;
  tab_str_t tVar11;
  htab_hash_t hVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  char *pcVar16;
  void_ptr_t *ppvVar17;
  htab_ind_t *phVar18;
  HTAB_EL_tab_str_t *pHVar19;
  undefined1 *puVar20;
  void *extraout_RAX;
  void *extraout_RAX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FILE *in_RCX;
  uint *puVar21;
  uint uVar22;
  tab_str_t *res;
  ulong extraout_RDX;
  long lVar23;
  ulong unaff_RBP;
  uint *puVar24;
  FILE *htab;
  FILE *pFVar25;
  FILE *pFVar26;
  FILE *__ptr_00;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  void_ptr_t unaff_R14;
  void_ptr_t *ppvVar30;
  uint uVar31;
  void_ptr_t unaff_R15;
  void_ptr_t unaff_retaddr;
  void_ptr_t in_stack_00000008;
  
  pvVar15 = malloc(s);
  if (pvVar15 == (void *)0x0) {
    s = 0;
    (*c2m_ctx->error_func)(c2m_ctx,C_alloc_error,"no memory");
  }
  __ptr_00 = (FILE *)c2m_ctx->reg_memory;
  htab = (FILE *)__ptr_00->_IO_read_end;
  if (htab != (FILE *)0x0) {
    pcVar16 = (char *)(*(size_t *)__ptr_00 + 1);
    if (__ptr_00->_IO_read_ptr < pcVar16) {
      ppvVar17 = (void_ptr_t *)realloc(htab,(long)(pcVar16 + ((ulong)pcVar16 >> 1)) * 8);
      __ptr_00->_IO_read_end = (char *)ppvVar17;
      __ptr_00->_IO_read_ptr = pcVar16 + ((ulong)pcVar16 >> 1);
    }
    sVar2 = *(size_t *)__ptr_00;
    *(size_t *)__ptr_00 = sVar2 + 1;
    *(void **)((long)__ptr_00->_IO_read_end + sVar2 * 8) = pvVar15;
    return pvVar15;
  }
  reg_malloc_cold_1();
  pVVar3 = (VARR_htab_ind_t *)htab->_IO_buf_base;
  pFVar25 = htab;
  if (pVVar3 == (VARR_htab_ind_t *)0x0) {
    HTAB_tab_str_t_do_cold_8();
    htab = (FILE *)s;
LAB_0017b915:
    HTAB_tab_str_t_do_cold_7();
LAB_0017b91a:
    HTAB_tab_str_t_do_cold_2();
LAB_0017b91f:
    HTAB_tab_str_t_do_cold_1();
LAB_0017b924:
    HTAB_tab_str_t_do_cold_4();
LAB_0017b929:
    HTAB_tab_str_t_do_cold_6();
LAB_0017b92e:
    HTAB_tab_str_t_do_cold_5();
  }
  else {
    __ptr_00 = (FILE *)(s & 0xffffffff);
    if ((VARR_HTAB_EL_tab_str_t *)htab->_IO_write_end == (VARR_HTAB_EL_tab_str_t *)0x0)
    goto LAB_0017b915;
    uVar22 = (uint)pVVar3->els_num;
    pFVar26 = (FILE *)htab->_IO_read_end;
    in_RCX = pFVar26;
    uVar27 = uVar22;
    if ((int)s != 1) {
LAB_0017b7b3:
      tVar10.str.len = (size_t)unaff_R15;
      tVar10.str.s = (char *)unaff_R14;
      tVar10.key = (size_t)unaff_retaddr;
      tVar10.flags = (size_t)in_stack_00000008;
      pFVar25 = pFVar26;
      hVar12 = (*(code *)htab->_IO_read_base)(tVar10,pFVar26);
      uVar22 = hVar12 + (hVar12 == 0);
      if ((VARR_htab_ind_t *)htab->_IO_buf_base == (VARR_htab_ind_t *)0x0) goto LAB_0017b91a;
      in_RCX = (FILE *)htab->_IO_write_end;
      if (in_RCX != (FILE *)0x0) {
        phVar18 = ((VARR_htab_ind_t *)htab->_IO_buf_base)->varr;
        ppvVar17 = (void_ptr_t *)in_RCX->_IO_read_end;
        puVar24 = (uint *)0x0;
        uVar28 = uVar22;
        uVar31 = uVar22;
        do {
          uVar31 = uVar31 & uVar27 - 1;
          puVar21 = phVar18 + uVar31;
          uVar29 = (ulong)*puVar21;
          if (uVar29 != 0xfffffffe) {
            if (*puVar21 == 0xffffffff) {
              if ((int)s != 1) {
                return (void *)0x0;
              }
              htab->_flags = htab->_flags + 1;
              if (puVar24 != (uint *)0x0) {
                puVar21 = puVar24;
              }
              uVar27 = *(uint *)&htab->_IO_read_ptr;
              *(uint *)(ppvVar17 + (ulong)uVar27 * 5) = uVar22;
              ppvVar30 = (void_ptr_t *)&stack0xfffffffffffffff0;
              ppvVar17 = ppvVar17 + (ulong)uVar27 * 5 + 1;
              *ppvVar17 = unaff_R14;
              ppvVar17[1] = unaff_R15;
              ppvVar17[2] = unaff_retaddr;
              ppvVar17[3] = in_stack_00000008;
              uVar22 = *(uint *)&htab->_IO_read_ptr;
              *(uint *)&htab->_IO_read_ptr = uVar22 + 1;
              *puVar21 = uVar22;
              puVar20 = (undefined1 *)0x0;
              goto LAB_0017b8f0;
            }
            puVar21 = puVar24;
            if ((*(uint *)(ppvVar17 + uVar29 * 5) == uVar22) &&
               (tVar11.str.len = (size_t)unaff_R15, tVar11.str.s = (char *)unaff_R14,
               tVar11.key = (size_t)unaff_retaddr, tVar11.flags = (size_t)in_stack_00000008,
               iVar13 = (*(code *)htab->_IO_write_base)
                                  (*(tab_str_t *)(ppvVar17 + uVar29 * 5 + 1),tVar11,pFVar26),
               iVar13 != 0)) {
              ppvVar30 = ppvVar17 + uVar29 * 5 + 1;
              puVar20 = &DAT_00000001;
LAB_0017b8f0:
              pvVar7 = ppvVar30[1];
              pvVar8 = ppvVar30[2];
              pvVar9 = ppvVar30[3];
              (res->str).s = (char *)*ppvVar30;
              (res->str).len = (size_t)pvVar7;
              res->key = (size_t)pvVar8;
              res->flags = (size_t)pvVar9;
              return puVar20;
            }
          }
          uVar28 = uVar28 >> 0xb;
          uVar31 = uVar28 + 1 + uVar31 * 5;
          phVar1 = (htab_size_t *)((long)&htab->_IO_read_ptr + 4);
          *phVar1 = *phVar1 + 1;
          puVar24 = puVar21;
        } while( true );
      }
      goto LAB_0017b91f;
    }
    unaff_RBP = ((VARR_HTAB_EL_tab_str_t *)htab->_IO_write_end)->els_num;
    if (*(htab_size_t *)&htab->_IO_read_ptr != (htab_size_t)unaff_RBP) goto LAB_0017b7b3;
    pFVar25 = (FILE *)pVVar3->varr;
    if (pFVar25 == (FILE *)0x0) goto LAB_0017b929;
    uVar27 = uVar22 * 2;
    uVar29 = (ulong)uVar27;
    if (pVVar3->size != uVar29) {
      phVar18 = (htab_ind_t *)realloc(pFVar25,uVar29 * 4);
      pVVar3->varr = phVar18;
    }
    pVVar3->size = uVar29;
    pVVar3->els_num = uVar29;
    if ((VARR_htab_ind_t *)htab->_IO_buf_base == (VARR_htab_ind_t *)0x0) goto LAB_0017b92e;
    if (uVar27 != 0) {
      pFVar25 = (FILE *)((VARR_htab_ind_t *)htab->_IO_buf_base)->varr;
      memset(pFVar25,0xff,(ulong)(uVar22 & 0x7fffffff) << 3);
    }
    pVVar4 = (VARR_HTAB_EL_tab_str_t *)htab->_IO_write_end;
    if ((pVVar4 == (VARR_HTAB_EL_tab_str_t *)0x0) ||
       (pFVar25 = (FILE *)pVVar4->varr, pFVar25 == (FILE *)0x0)) goto LAB_0017b924;
    unaff_RBP = (ulong)((htab_size_t)unaff_RBP * 2);
    if (pVVar4->size != unaff_RBP) {
      pHVar19 = (HTAB_EL_tab_str_t *)realloc(pFVar25,unaff_RBP * 0x28);
      pVVar4->varr = pHVar19;
    }
    pVVar4->size = unaff_RBP;
    pVVar4->els_num = unaff_RBP;
    if ((VARR_HTAB_EL_tab_str_t *)htab->_IO_write_end != (VARR_HTAB_EL_tab_str_t *)0x0) {
      in_RCX = (FILE *)((VARR_HTAB_EL_tab_str_t *)htab->_IO_write_end)->varr;
      uVar22 = *(uint *)&htab->field_0x4;
      uVar31 = *(uint *)&htab->_IO_read_ptr;
      htab->_flags = 0;
      *(htab_size_t *)&htab->_IO_read_ptr = 0;
      *(htab_size_t *)&htab->field_0x4 = 0;
      if (uVar22 < uVar31) {
        __ptr_00 = (FILE *)(in_RCX->_shortbuf + (ulong)uVar22 * 0x28 + -0x7b);
        lVar23 = (ulong)uVar31 - (ulong)uVar22;
        do {
          if ((int)((tab_str_t *)((long)__ptr_00 + -0x20))->flags != 0) {
            HTAB_tab_str_t_do((HTAB_tab_str_t *)htab,*(tab_str_t *)__ptr_00,HTAB_INSERT,res);
            (*(code *)htab->_IO_write_base)(*res,*(tab_str_t *)__ptr_00,pFVar26);
          }
          __ptr_00 = (FILE *)&(((tab_str_t *)((long)__ptr_00 + 0x20))->str).len;
          lVar23 = lVar23 + -1;
        } while (lVar23 != 0);
      }
      goto LAB_0017b7b3;
    }
  }
  HTAB_tab_str_t_do_cold_3();
  iVar13 = (int)in_RCX;
  puVar5 = *(undefined8 **)pFVar25;
  pFVar26 = pFVar25;
  if (puVar5[5] == 0) {
LAB_0017b9dd:
    sVar2 = *(size_t *)pFVar25;
    __ptr_00 = *(FILE **)(sVar2 + 0x30);
    if ((__ptr_00 == (FILE *)0x0) ||
       (pFVar26 = (FILE *)__ptr_00->_IO_read_end, pFVar26 == (FILE *)0x0)) {
      HTAB_tab_str_t_destroy_cold_4();
    }
    else {
      free(pFVar26);
      free(__ptr_00);
      *(undefined8 *)(sVar2 + 0x30) = 0;
      sVar2 = *(size_t *)pFVar25;
      __ptr = *(FILE **)(sVar2 + 0x38);
      pFVar26 = __ptr_00;
      __ptr_00 = __ptr;
      if ((__ptr != (FILE *)0x0) && (pFVar26 = (FILE *)__ptr->_IO_read_end, pFVar26 != (FILE *)0x0))
      {
        free(pFVar26);
        free(__ptr);
        *(undefined8 *)(sVar2 + 0x38) = 0;
        free(*(void **)pFVar25);
        *(size_t *)pFVar25 = 0;
        return extraout_RAX;
      }
    }
    HTAB_tab_str_t_destroy_cold_3();
  }
  else if (puVar5[6] != 0) {
    if (*(int *)(puVar5 + 1) != 0) {
      __ptr_00 = (FILE *)puVar5[2];
      lVar23 = *(long *)(puVar5[6] + 0x10) + 8;
      uVar29 = 0;
      do {
        if (*(int *)(lVar23 + -8) != 0) {
          pFVar26 = __ptr_00;
          (*(code *)puVar5[5])();
        }
        iVar13 = (int)in_RCX;
        uVar29 = uVar29 + 1;
        lVar23 = lVar23 + 0x28;
      } while (uVar29 < *(uint *)(puVar5 + 1));
    }
    *(undefined4 *)(puVar5 + 1) = 0;
    *puVar5 = 0;
    puVar6 = (ulong *)puVar5[7];
    if (puVar6 == (ulong *)0x0) goto LAB_0017ba58;
    iVar13 = (int)*puVar6;
    if (iVar13 != 0) {
      pFVar26 = (FILE *)puVar6[2];
      htab = (FILE *)0xff;
      memset(pFVar26,0xff,(*puVar6 & 0xffffffff) << 2);
    }
    goto LAB_0017b9dd;
  }
  HTAB_tab_str_t_destroy_cold_2();
LAB_0017ba58:
  HTAB_tab_str_t_destroy_cold_1();
  pvVar15 = extraout_RAX_00;
  if (-1 < (int)extraout_RDX) {
    iVar14 = fprintf(pFVar26,"%s:%d",htab,extraout_RDX & 0xffffffff,in_R8,in_R9,pFVar25,__ptr_00,
                     unaff_RBP);
    pvVar15 = (void *)CONCAT44(extraout_var,iVar14);
    if (iVar13 != 0) {
      iVar13 = fprintf(pFVar26,":%d: ",extraout_RDX >> 0x20);
      return (void *)CONCAT44(extraout_var_00,iVar13);
    }
  }
  return pvVar15;
}

Assistant:

static void *reg_malloc (c2m_ctx_t c2m_ctx, size_t s) {
  void *mem = malloc (s);

  if (mem == NULL) alloc_error (c2m_ctx, "no memory");
  VARR_PUSH (void_ptr_t, reg_memory, mem);
  return mem;
}